

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::wrapToSmallerSize
          (Literal *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Literal *value
          ,Index bytes)

{
  bool bVar1;
  Literal local_b8;
  Literal local_a0;
  Literal local_88;
  BasicType local_6c;
  Literal local_68;
  Literal local_40;
  BasicType local_28;
  Index local_24;
  Literal *pLStack_20;
  Index bytes_local;
  Literal *value_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  local_28 = i32;
  local_24 = bytes;
  pLStack_20 = value;
  value_local = (Literal *)this;
  this_local = (ModuleRunnerBase<wasm::ModuleRunner> *)__return_storage_ptr__;
  bVar1 = Type::operator==(&value->type,&local_28);
  if (bVar1) {
    if (local_24 == 1) {
      wasm::Literal::Literal(&local_40,0xff);
      ::wasm::Literal::and_(__return_storage_ptr__);
      ::wasm::Literal::~Literal(&local_40);
      return __return_storage_ptr__;
    }
    if (local_24 == 2) {
      wasm::Literal::Literal(&local_68,0xffff);
      ::wasm::Literal::and_(__return_storage_ptr__);
      ::wasm::Literal::~Literal(&local_68);
      return __return_storage_ptr__;
    }
    if (local_24 != 4) {
      ::wasm::handle_unreachable
                ("unexpected bytes",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x1172);
    }
LAB_001cc9ee:
    ::wasm::Literal::Literal(__return_storage_ptr__,value);
  }
  else {
    local_6c = i64;
    bVar1 = Type::operator==(&value->type,&local_6c);
    if (!bVar1) {
      __assert_fail("value.type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x1175,
                    "Literal wasm::ModuleRunnerBase<wasm::ModuleRunner>::wrapToSmallerSize(Literal, Index) [SubType = wasm::ModuleRunner]"
                   );
    }
    switch(local_24) {
    case 1:
      wasm::Literal::Literal(&local_88,0xff);
      ::wasm::Literal::and_(__return_storage_ptr__);
      ::wasm::Literal::~Literal(&local_88);
      break;
    case 2:
      wasm::Literal::Literal(&local_a0,0xffff);
      ::wasm::Literal::and_(__return_storage_ptr__);
      ::wasm::Literal::~Literal(&local_a0);
      break;
    default:
      ::wasm::handle_unreachable
                ("unexpected bytes",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x1184);
    case 4:
      wasm::Literal::Literal(&local_b8,0xffffffff);
      ::wasm::Literal::and_(__return_storage_ptr__);
      ::wasm::Literal::~Literal(&local_b8);
      break;
    case 8:
      goto LAB_001cc9ee;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literal wrapToSmallerSize(Literal value, Index bytes) {
    if (value.type == Type::i32) {
      switch (bytes) {
        case 1: {
          return value.and_(Literal(uint32_t(0xff)));
        }
        case 2: {
          return value.and_(Literal(uint32_t(0xffff)));
        }
        case 4: {
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected bytes");
      }
    } else {
      assert(value.type == Type::i64);
      switch (bytes) {
        case 1: {
          return value.and_(Literal(uint64_t(0xff)));
        }
        case 2: {
          return value.and_(Literal(uint64_t(0xffff)));
        }
        case 4: {
          return value.and_(Literal(uint64_t(0xffffffffUL)));
        }
        case 8: {
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected bytes");
      }
    }
    return value;
  }